

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  BVH *bvh;
  NodeRef root;
  Scene *pSVar5;
  float *pfVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  size_t k;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  byte bVar23;
  int iVar24;
  float *vertices;
  long lVar25;
  byte bVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  NodeRef *pNVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  uint uVar32;
  undefined4 uVar33;
  ushort uVar34;
  bool bVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 ai_2;
  vint4 bi;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar52 [16];
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_2;
  undefined1 auVar55 [16];
  vint4 ai_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar80 [64];
  byte local_19c5;
  Precalculations pre;
  vuint<4> *v;
  undefined1 local_1968 [16];
  ulong local_1958;
  ulong local_1950;
  int local_1948;
  int iStack_1944;
  int iStack_1940;
  int iStack_193c;
  RTCFilterFunctionNArguments args;
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [8];
  float fStack_18b0;
  float fStack_18ac;
  undefined1 local_18a8 [8];
  float fStack_18a0;
  float fStack_189c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  TravRayK<4,_false> tray;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar38 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar43 = ZEXT816(0) << 0x40;
    uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar43,5);
    uVar36 = vpcmpeqd_avx512vl(auVar38,(undefined1  [16])valid_i->field_0);
    uVar36 = ((byte)uVar15 & 0xf) & uVar36;
    bVar23 = (byte)uVar36;
    if (bVar23 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = ZEXT1664(auVar38);
      auVar39 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar38);
      auVar41._8_4_ = 0x219392ef;
      auVar41._0_8_ = 0x219392ef219392ef;
      auVar41._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar39,auVar41,1);
      bVar35 = (bool)((byte)uVar29 & 1);
      auVar39._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._0_4_;
      bVar35 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._4_4_;
      bVar35 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._8_4_;
      bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._12_4_;
      auVar40 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar38);
      uVar29 = vcmpps_avx512vl(auVar40,auVar41,1);
      bVar35 = (bool)((byte)uVar29 & 1);
      auVar40._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._16_4_;
      bVar35 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._20_4_;
      bVar35 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._24_4_;
      bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._28_4_;
      auVar38 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar38);
      uVar29 = vcmpps_avx512vl(auVar38,auVar41,1);
      bVar35 = (bool)((byte)uVar29 & 1);
      auVar38._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._32_4_;
      bVar35 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._36_4_;
      bVar35 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._40_4_;
      bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._44_4_;
      auVar41 = vrcp14ps_avx512vl(auVar39);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar76 = ZEXT1664(auVar42);
      auVar39 = vfnmadd213ps_avx512vl(auVar39,auVar41,auVar42);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar39,auVar41,auVar41)
      ;
      auVar39 = vrcp14ps_avx512vl(auVar40);
      auVar40 = vfnmadd213ps_avx512vl(auVar40,auVar39,auVar42);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar40,auVar39,auVar39)
      ;
      auVar39 = vrcp14ps_avx512vl(auVar38);
      auVar38 = vfnmadd213ps_avx512vl(auVar38,auVar39,auVar42);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar38,auVar39,auVar39)
      ;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar43,1);
      auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar29 & 1) * auVar38._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar43,5);
      auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar35 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar35 * auVar38._0_4_ | (uint)!bVar35 * 0x30;
      bVar35 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * 0x30;
      bVar35 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * 0x30;
      bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * 0x30;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar43,5);
      auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar35 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar35 * auVar38._0_4_ | (uint)!bVar35 * 0x50;
      bVar35 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * 0x50;
      bVar35 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * 0x50;
      bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * 0x50;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar78 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar38 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar43);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar23 & 1) * auVar38._0_4_ |
           (uint)!(bool)(bVar23 & 1) * stack_near[0].field_0._0_4_;
      bVar35 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * stack_near[0].field_0._4_4_;
      bVar35 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * stack_near[0].field_0._8_4_;
      bVar35 = SUB81(uVar36 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * stack_near[0].field_0._12_4_;
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar77 = ZEXT1664(auVar38);
      auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar43);
      tray.tfar.field_0.i[0] =
           (uint)(bVar23 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar38._0_4_;
      bVar35 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * auVar38._4_4_;
      bVar35 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * auVar38._8_4_;
      bVar35 = SUB81(uVar36 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * auVar38._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar34 = (ushort)uVar36 ^ 0xf;
      pNVar30 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar31 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar79 = ZEXT1664(auVar38);
      auVar38 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar80 = ZEXT1664(auVar38);
LAB_0073374d:
      paVar31 = paVar31 + -1;
      root.ptr = pNVar30[-1].ptr;
      pNVar30 = pNVar30 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00733f45;
      aVar62 = *paVar31;
      uVar36 = vcmpps_avx512vl((undefined1  [16])aVar62,(undefined1  [16])tray.tfar.field_0,1);
      if ((char)uVar36 == '\0') {
LAB_00733f7a:
        iVar24 = 2;
      }
      else {
        uVar33 = (undefined4)uVar36;
        iVar24 = 0;
        if ((uint)POPCOUNT(uVar33) <= uVar32) {
          do {
            k = 0;
            for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            bVar35 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            bVar26 = (byte)(1 << ((uint)k & 0x1f));
            if (!bVar35) {
              bVar26 = 0;
            }
            bVar26 = (byte)uVar34 | bVar26;
            uVar34 = (ushort)bVar26;
            uVar36 = uVar36 - 1 & uVar36;
          } while (uVar36 != 0);
          uVar34 = (ushort)bVar26;
          if (bVar26 == 0xf) {
            iVar24 = 3;
          }
          else {
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar26 & 1) * auVar38._0_4_ |
                 (uint)!(bool)(bVar26 & 1) * tray.tfar.field_0.i[0];
            bVar35 = (bool)(bVar26 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
            bVar35 = (bool)(bVar26 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
            bVar35 = (bool)(bVar26 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
            iVar24 = 2;
          }
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar75 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar76 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar77 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar78 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar79 = ZEXT1664(auVar38);
          auVar38 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
          auVar80 = ZEXT1664(auVar38);
        }
        if (uVar32 < (uint)POPCOUNT(uVar33)) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00733f45;
              uVar15 = vcmpps_avx512vl((undefined1  [16])aVar62,(undefined1  [16])tray.tfar.field_0,
                                       9);
              if ((char)uVar15 == '\0') goto LAB_00733f7a;
              local_19c5 = (byte)uVar34 & 0xf;
              local_1958 = (ulong)((uint)root.ptr & 0xf) - 8;
              if (local_1958 == 0) goto LAB_00733f37;
              local_19c5 = local_19c5 ^ 0xf;
              lVar28 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              uVar36 = 0;
              goto LAB_0073396f;
            }
            auVar65 = ZEXT1664(auVar78._0_16_);
            uVar36 = 0;
            uVar29 = 8;
            do {
              uVar27 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar36 * 8);
              if (uVar27 != 8) {
                auVar20._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar20._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar20._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar20._12_4_ = tray.org_rdir.field_0._12_4_;
                uVar33 = *(undefined4 *)(root.ptr + 0x20 + uVar36 * 4);
                auVar53._4_4_ = uVar33;
                auVar53._0_4_ = uVar33;
                auVar53._8_4_ = uVar33;
                auVar53._12_4_ = uVar33;
                auVar39 = vfmsub132ps_fma(auVar53,auVar20,
                                          (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
                uVar33 = *(undefined4 *)(root.ptr + 0x40 + uVar36 * 4);
                auVar56._4_4_ = uVar33;
                auVar56._0_4_ = uVar33;
                auVar56._8_4_ = uVar33;
                auVar56._12_4_ = uVar33;
                auVar21._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar21._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar21._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar21._12_4_ = tray.org_rdir.field_0._44_4_;
                uVar33 = *(undefined4 *)(root.ptr + 0x60 + uVar36 * 4);
                auVar60._4_4_ = uVar33;
                auVar60._0_4_ = uVar33;
                auVar60._8_4_ = uVar33;
                auVar60._12_4_ = uVar33;
                auVar40 = vfmsub132ps_fma(auVar56,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
                auVar41 = vfmsub132ps_fma(auVar60,auVar21,
                                          (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
                uVar33 = *(undefined4 *)(root.ptr + 0x30 + uVar36 * 4);
                auVar17._4_4_ = uVar33;
                auVar17._0_4_ = uVar33;
                auVar17._8_4_ = uVar33;
                auVar17._12_4_ = uVar33;
                auVar42 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar20,
                                     auVar17);
                uVar33 = *(undefined4 *)(root.ptr + 0x50 + uVar36 * 4);
                auVar18._4_4_ = uVar33;
                auVar18._0_4_ = uVar33;
                auVar18._8_4_ = uVar33;
                auVar18._12_4_ = uVar33;
                auVar44 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,
                                     auVar18);
                uVar33 = *(undefined4 *)(root.ptr + 0x70 + uVar36 * 4);
                auVar19._4_4_ = uVar33;
                auVar19._0_4_ = uVar33;
                auVar19._8_4_ = uVar33;
                auVar19._12_4_ = uVar33;
                auVar45 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar21,
                                     auVar19);
                auVar38 = vpminsd_avx(auVar39,auVar42);
                auVar43 = vpminsd_avx(auVar40,auVar44);
                auVar38 = vpmaxsd_avx(auVar38,auVar43);
                auVar43 = vpminsd_avx(auVar41,auVar45);
                auVar38 = vpmaxsd_avx(auVar38,auVar43);
                auVar43 = vpmaxsd_avx(auVar39,auVar42);
                auVar39 = vpmaxsd_avx(auVar40,auVar44);
                auVar39 = vpminsd_avx(auVar43,auVar39);
                auVar43 = vpmaxsd_avx(auVar41,auVar45);
                auVar39 = vpminsd_avx(auVar39,auVar43);
                auVar43 = vpmaxsd_avx(auVar38,(undefined1  [16])tray.tnear.field_0);
                auVar39 = vpminsd_avx(auVar39,(undefined1  [16])tray.tfar.field_0);
                uVar37 = vpcmpd_avx512vl(auVar43,auVar39,2);
                uVar37 = uVar37 & 0xf;
                if ((byte)uVar37 != 0) {
                  auVar43 = vblendmps_avx512vl(auVar78._0_16_,auVar38);
                  bVar35 = (bool)((byte)uVar37 & 1);
                  bVar9 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar11 = SUB81(uVar37 >> 3,0);
                  if (uVar29 != 8) {
                    pNVar30->ptr = uVar29;
                    pNVar30 = pNVar30 + 1;
                    *paVar31 = auVar65._0_16_;
                    paVar31 = paVar31 + 1;
                  }
                  auVar65 = ZEXT1664(CONCAT412((uint)bVar11 * auVar43._12_4_ |
                                               (uint)!bVar11 * auVar38._12_4_,
                                               CONCAT48((uint)bVar10 * auVar43._8_4_ |
                                                        (uint)!bVar10 * auVar38._8_4_,
                                                        CONCAT44((uint)bVar9 * auVar43._4_4_ |
                                                                 (uint)!bVar9 * auVar38._4_4_,
                                                                 (uint)bVar35 * auVar43._0_4_ |
                                                                 (uint)!bVar35 * auVar38._0_4_))));
                  uVar29 = uVar27;
                }
              }
              aVar62 = auVar65._0_16_;
            } while ((uVar27 != 8) && (bVar35 = uVar36 < 3, uVar36 = uVar36 + 1, bVar35));
            iVar24 = 0;
            if (uVar29 == 8) {
LAB_0073391d:
              bVar35 = false;
              iVar24 = 4;
            }
            else {
              uVar15 = vcmpps_avx512vl((undefined1  [16])aVar62,(undefined1  [16])tray.tfar.field_0,
                                       9);
              bVar35 = true;
              if ((uint)POPCOUNT((int)uVar15) <= uVar32) {
                pNVar30->ptr = uVar29;
                pNVar30 = pNVar30 + 1;
                *paVar31 = aVar62;
                paVar31 = paVar31 + 1;
                goto LAB_0073391d;
              }
            }
            root.ptr = uVar29;
          } while (bVar35);
        }
      }
      goto LAB_00733f6c;
    }
  }
  return;
  while( true ) {
    uVar36 = local_1950 + 1;
    lVar28 = lVar28 + 0x50;
    if (local_1958 <= uVar36) break;
LAB_0073396f:
    lVar25 = uVar36 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    pSVar5 = context->scene;
    uVar29 = 0;
    local_1950 = uVar36;
    bVar26 = local_19c5;
    while (*(int *)(lVar28 + uVar29 * 4) != -1) {
      pfVar6 = (pSVar5->vertices).items[*(uint *)(lVar28 + -0x10 + uVar29 * 4)];
      uVar36 = (ulong)*(uint *)(lVar28 + -0x40 + uVar29 * 4);
      fVar2 = pfVar6[uVar36];
      auVar45._4_4_ = fVar2;
      auVar45._0_4_ = fVar2;
      auVar45._8_4_ = fVar2;
      auVar45._12_4_ = fVar2;
      uVar27 = (ulong)*(uint *)(lVar28 + -0x30 + uVar29 * 4);
      fVar3 = pfVar6[uVar36 + 1];
      auVar54._4_4_ = fVar3;
      auVar54._0_4_ = fVar3;
      auVar54._8_4_ = fVar3;
      auVar54._12_4_ = fVar3;
      fVar4 = pfVar6[uVar36 + 2];
      auVar57._4_4_ = fVar4;
      auVar57._0_4_ = fVar4;
      auVar57._8_4_ = fVar4;
      auVar57._12_4_ = fVar4;
      uVar36 = (ulong)*(uint *)(lVar28 + -0x20 + uVar29 * 4);
      fVar12 = fVar2 - pfVar6[uVar27];
      fVar13 = fVar3 - pfVar6[uVar27 + 1];
      fVar14 = fVar4 - pfVar6[uVar27 + 2];
      local_1888 = *(undefined8 *)(lVar25 + 0x30);
      uStack_1880 = *(undefined8 *)(lVar25 + 0x38);
      auVar59._4_4_ = fVar12;
      auVar59._0_4_ = fVar12;
      auVar59._8_4_ = fVar12;
      auVar59._12_4_ = fVar12;
      auVar61._4_4_ = fVar13;
      auVar61._0_4_ = fVar13;
      auVar61._8_4_ = fVar13;
      auVar61._12_4_ = fVar13;
      auVar48._4_4_ = fVar14;
      auVar48._0_4_ = fVar14;
      auVar48._8_4_ = fVar14;
      auVar48._12_4_ = fVar14;
      fVar2 = pfVar6[uVar36] - fVar2;
      auVar74._4_4_ = fVar2;
      auVar74._0_4_ = fVar2;
      auVar74._8_4_ = fVar2;
      auVar74._12_4_ = fVar2;
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar6[uVar36 + 1] - fVar3)));
      auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar6[uVar36 + 2] - fVar4)));
      fVar13 = fVar13 * (pfVar6[uVar36 + 2] - fVar4);
      auVar43._4_4_ = fVar13;
      auVar43._0_4_ = fVar13;
      auVar43._8_4_ = fVar13;
      auVar43._12_4_ = fVar13;
      auVar48 = vfmsub231ps_avx512vl(auVar43,auVar46,auVar48);
      fVar2 = fVar14 * fVar2;
      auVar42._4_4_ = fVar2;
      auVar42._0_4_ = fVar2;
      auVar42._8_4_ = fVar2;
      auVar42._12_4_ = fVar2;
      auVar49 = vfmsub231ps_avx512vl(auVar42,auVar47,auVar59);
      fVar12 = (pfVar6[uVar36 + 1] - fVar3) * fVar12;
      auVar44._4_4_ = fVar12;
      auVar44._0_4_ = fVar12;
      auVar44._8_4_ = fVar12;
      auVar44._12_4_ = fVar12;
      auVar44 = vfmsub231ps_fma(auVar44,auVar74,auVar61);
      auVar40 = vsubps_avx(auVar45,*(undefined1 (*) [16])ray);
      auVar41 = vsubps_avx(auVar54,*(undefined1 (*) [16])(ray + 0x10));
      auVar42 = vsubps_avx(auVar57,*(undefined1 (*) [16])(ray + 0x20));
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      auVar43 = *(undefined1 (*) [16])(ray + 0x50);
      auVar39 = *(undefined1 (*) [16])(ray + 0x60);
      auVar71._0_4_ = auVar43._0_4_ * auVar42._0_4_;
      auVar71._4_4_ = auVar43._4_4_ * auVar42._4_4_;
      auVar71._8_4_ = auVar43._8_4_ * auVar42._8_4_;
      auVar71._12_4_ = auVar43._12_4_ * auVar42._12_4_;
      auVar45 = vfmsub231ps_fma(auVar71,auVar41,auVar39);
      auVar72._0_4_ = auVar39._0_4_ * auVar40._0_4_;
      auVar72._4_4_ = auVar39._4_4_ * auVar40._4_4_;
      auVar72._8_4_ = auVar39._8_4_ * auVar40._8_4_;
      auVar72._12_4_ = auVar39._12_4_ * auVar40._12_4_;
      auVar54 = vfmsub231ps_fma(auVar72,auVar42,auVar38);
      auVar73._0_4_ = auVar38._0_4_ * auVar41._0_4_;
      auVar73._4_4_ = auVar38._4_4_ * auVar41._4_4_;
      auVar73._8_4_ = auVar38._8_4_ * auVar41._8_4_;
      auVar73._12_4_ = auVar38._12_4_ * auVar41._12_4_;
      auVar57 = vfmsub231ps_fma(auVar73,auVar40,auVar43);
      auVar58._0_4_ = auVar44._0_4_ * auVar39._0_4_;
      auVar58._4_4_ = auVar44._4_4_ * auVar39._4_4_;
      auVar58._8_4_ = auVar44._8_4_ * auVar39._8_4_;
      auVar58._12_4_ = auVar44._12_4_ * auVar39._12_4_;
      auVar43 = vfmadd231ps_fma(auVar58,auVar49,auVar43);
      auVar38 = vfmadd231ps_fma(auVar43,auVar48,auVar38);
      auVar39 = vandps_avx512vl(auVar38,auVar79._0_16_);
      auVar43 = vmulps_avx512vl(auVar47,auVar57);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar54,auVar46);
      auVar43 = vfmadd231ps_fma(auVar43,auVar45,auVar74);
      uVar67 = auVar39._0_4_;
      auVar46._0_4_ = uVar67 ^ auVar43._0_4_;
      uVar68 = auVar39._4_4_;
      auVar46._4_4_ = uVar68 ^ auVar43._4_4_;
      uVar69 = auVar39._8_4_;
      auVar46._8_4_ = uVar69 ^ auVar43._8_4_;
      uVar70 = auVar39._12_4_;
      auVar46._12_4_ = uVar70 ^ auVar43._12_4_;
      auVar43 = auVar80._0_16_;
      uVar15 = vcmpps_avx512vl(auVar46,auVar43,5);
      bVar22 = (byte)uVar15 & bVar26;
      if (bVar22 == 0) {
LAB_00733af0:
        bVar22 = 0;
      }
      else {
        auVar66._0_4_ = fVar14 * auVar57._0_4_;
        auVar66._4_4_ = fVar14 * auVar57._4_4_;
        auVar66._8_4_ = fVar14 * auVar57._8_4_;
        auVar66._12_4_ = fVar14 * auVar57._12_4_;
        auVar39 = vfmadd213ps_fma(auVar54,auVar61,auVar66);
        auVar39 = vfmadd213ps_fma(auVar45,auVar59,auVar39);
        auVar47._0_4_ = uVar67 ^ auVar39._0_4_;
        auVar47._4_4_ = uVar68 ^ auVar39._4_4_;
        auVar47._8_4_ = uVar69 ^ auVar39._8_4_;
        auVar47._12_4_ = uVar70 ^ auVar39._12_4_;
        uVar15 = vcmpps_avx512vl(auVar47,auVar43,5);
        bVar22 = bVar22 & (byte)uVar15;
        if (bVar22 == 0) goto LAB_00733af0;
        auVar45 = vandps_avx512vl(auVar38,auVar75._0_16_);
        auVar39 = vsubps_avx(auVar45,auVar46);
        uVar15 = vcmpps_avx512vl(auVar39,auVar47,5);
        bVar22 = bVar22 & (byte)uVar15;
        if (bVar22 == 0) {
LAB_00733e4f:
          bVar22 = 0;
        }
        else {
          auVar63._0_4_ = auVar42._0_4_ * auVar44._0_4_;
          auVar63._4_4_ = auVar42._4_4_ * auVar44._4_4_;
          auVar63._8_4_ = auVar42._8_4_ * auVar44._8_4_;
          auVar63._12_4_ = auVar42._12_4_ * auVar44._12_4_;
          auVar39 = vfmadd213ps_fma(auVar41,auVar49,auVar63);
          auVar39 = vfmadd213ps_fma(auVar40,auVar48,auVar39);
          auVar55._0_4_ = auVar45._0_4_ * *(float *)(ray + 0x30);
          auVar55._4_4_ = auVar45._4_4_ * *(float *)(ray + 0x34);
          auVar55._8_4_ = auVar45._8_4_ * *(float *)(ray + 0x38);
          auVar55._12_4_ = auVar45._12_4_ * *(float *)(ray + 0x3c);
          auVar52._0_4_ = uVar67 ^ auVar39._0_4_;
          auVar52._4_4_ = uVar68 ^ auVar39._4_4_;
          auVar52._8_4_ = uVar69 ^ auVar39._8_4_;
          auVar52._12_4_ = uVar70 ^ auVar39._12_4_;
          auVar64._0_4_ = auVar45._0_4_ * *(float *)(ray + 0x80);
          auVar64._4_4_ = auVar45._4_4_ * *(float *)(ray + 0x84);
          auVar64._8_4_ = auVar45._8_4_ * *(float *)(ray + 0x88);
          auVar64._12_4_ = auVar45._12_4_ * *(float *)(ray + 0x8c);
          uVar15 = vcmpps_avx512vl(auVar52,auVar64,2);
          uVar16 = vcmpps_avx512vl(auVar55,auVar52,1);
          bVar22 = bVar22 & (byte)uVar15 & (byte)uVar16;
          if (bVar22 == 0) goto LAB_00733e4f;
          uVar15 = vcmpps_avx512vl(auVar38,ZEXT816(0) << 0x20,4);
          bVar22 = bVar22 & (byte)uVar15;
          if (bVar22 != 0) {
            local_1908 = auVar44;
            local_18f8 = auVar49;
            local_18e8 = auVar48;
            local_18d8 = auVar45;
            local_18c8 = auVar52;
            _local_18b8 = auVar47;
            _local_18a8 = auVar46;
          }
        }
        auVar75 = ZEXT1664(auVar75._0_16_);
        auVar38 = vxorps_avx512vl(auVar43,auVar43);
        auVar80 = ZEXT1664(auVar38);
      }
      auVar38 = auVar80._0_16_;
      pGVar7 = (context->scene->geometries).items[*(uint *)((long)&local_1888 + uVar29 * 4)].ptr;
      uVar67 = pGVar7->mask;
      auVar49._4_4_ = uVar67;
      auVar49._0_4_ = uVar67;
      auVar49._8_4_ = uVar67;
      auVar49._12_4_ = uVar67;
      uVar15 = vptestmd_avx512vl(auVar49,*(undefined1 (*) [16])(ray + 0x90));
      bVar22 = (byte)uVar15 & 0xf & bVar22;
      uVar36 = (ulong)bVar22;
      if (bVar22 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar43 = vrcp14ps_avx512vl(local_18d8);
          auVar39 = vfnmadd213ps_avx512vl(auVar43,local_18d8,auVar76._0_16_);
          auVar43 = vfmadd132ps_fma(auVar39,auVar43,auVar43);
          local_1738._0_4_ = auVar43._0_4_ * (float)local_18a8._0_4_;
          local_1738._4_4_ = auVar43._4_4_ * (float)local_18a8._4_4_;
          local_1738._8_4_ = auVar43._8_4_ * fStack_18a0;
          local_1738._12_4_ = auVar43._12_4_ * fStack_189c;
          local_1708 = vpbroadcastd_avx512vl();
          local_1718 = vpbroadcastd_avx512vl();
          local_1768 = local_18e8._0_8_;
          uStack_1760 = local_18e8._8_8_;
          local_1758 = local_18f8._0_8_;
          uStack_1750 = local_18f8._8_8_;
          local_1748 = local_1908;
          local_1728 = auVar43._0_4_ * (float)local_18b8._0_4_;
          fStack_1724 = auVar43._4_4_ * (float)local_18b8._4_4_;
          fStack_1720 = auVar43._8_4_ * fStack_18b0;
          fStack_171c = auVar43._12_4_ * fStack_18ac;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          local_1948 = *(int *)(ray + 0x80);
          iStack_1944 = *(int *)(ray + 0x84);
          iStack_1940 = *(int *)(ray + 0x88);
          iStack_193c = *(int *)(ray + 0x8c);
          auVar43 = vmulps_avx512vl(auVar43,local_18c8);
          bVar35 = (bool)(bVar22 >> 1 & 1);
          bVar9 = (bool)(bVar22 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar22 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar22 & 1) * local_1948;
          *(uint *)(ray + 0x84) = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * iStack_1944;
          *(uint *)(ray + 0x88) = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * iStack_1940;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar22 >> 3) * auVar43._12_4_ | (uint)!(bool)(bVar22 >> 3) * iStack_193c;
          local_1968 = vpmovm2d_avx512vl((ulong)bVar22);
          args.valid = (int *)local_1968;
          args.geometryUserPtr = pGVar7->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar7->occlusionFilterN)(&args);
            auVar38 = vxorps_avx512vl(auVar38,auVar38);
            auVar80 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar79 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar78 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar77 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar76 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar75 = ZEXT1664(auVar38);
          }
          auVar38 = auVar80._0_16_;
          uVar36 = vptestmd_avx512vl(local_1968,local_1968);
          uVar36 = uVar36 & 0xf;
          if ((char)uVar36 != '\0') {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&args);
              auVar38 = vxorps_avx512vl(auVar38,auVar38);
              auVar80 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar79 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar78 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar77 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar76 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar75 = ZEXT1664(auVar38);
            }
            uVar36 = vptestmd_avx512vl(local_1968,local_1968);
            uVar36 = uVar36 & 0xf;
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar35 = (bool)((byte)uVar36 & 1);
            auVar50._0_4_ = (uint)bVar35 * auVar38._0_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x80)
            ;
            bVar35 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x84)
            ;
            bVar35 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x88)
            ;
            bVar35 = SUB81(uVar36 >> 3,0);
            auVar50._12_4_ =
                 (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
          }
          bVar35 = (bool)((byte)uVar36 & 1);
          auVar51._0_4_ = (uint)bVar35 * *(int *)pRVar1 | (uint)!bVar35 * local_1948;
          bVar35 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar51._4_4_ = (uint)bVar35 * *(int *)(ray + 0x84) | (uint)!bVar35 * iStack_1944;
          bVar35 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar51._8_4_ = (uint)bVar35 * *(int *)(ray + 0x88) | (uint)!bVar35 * iStack_1940;
          bVar35 = SUB81(uVar36 >> 3,0);
          auVar51._12_4_ = (uint)bVar35 * *(int *)(ray + 0x8c) | (uint)!bVar35 * iStack_193c;
          *(undefined1 (*) [16])pRVar1 = auVar51;
        }
        bVar26 = ((byte)uVar36 ^ 0xf) & bVar26;
      }
      if ((bVar26 == 0) || (bVar35 = 2 < uVar29, uVar29 = uVar29 + 1, bVar35)) break;
    }
    local_19c5 = local_19c5 & bVar26;
    if (local_19c5 == 0) break;
  }
  local_19c5 = local_19c5 ^ 0xf;
LAB_00733f37:
  local_19c5 = (byte)uVar34 | local_19c5;
  uVar34 = (ushort)local_19c5;
  if (local_19c5 == 0xf) {
LAB_00733f45:
    iVar24 = 3;
  }
  else {
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    tray.tfar.field_0.i[0] =
         (uint)(local_19c5 & 1) * auVar38._0_4_ |
         (uint)!(bool)(local_19c5 & 1) * tray.tfar.field_0.i[0];
    bVar35 = (bool)(local_19c5 >> 1 & 1);
    tray.tfar.field_0.i[1] = (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
    bVar35 = (bool)(local_19c5 >> 2 & 1);
    tray.tfar.field_0.i[2] = (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
    bVar35 = (bool)(local_19c5 >> 3 & 1);
    tray.tfar.field_0.i[3] = (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
    iVar24 = 0;
  }
LAB_00733f6c:
  if (iVar24 == 3) {
    bVar23 = (byte)uVar34 & bVar23;
    bVar35 = (bool)(bVar23 >> 1 & 1);
    bVar9 = (bool)(bVar23 >> 2 & 1);
    *(uint *)pRVar1 =
         (uint)(bVar23 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar23 & 1) * *(int *)pRVar1;
    *(uint *)(ray + 0x84) = (uint)bVar35 * auVar77._4_4_ | (uint)!bVar35 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar9 * auVar77._8_4_ | (uint)!bVar9 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar23 >> 3) * auVar77._12_4_ | (uint)!(bool)(bVar23 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_0073374d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }